

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

void NJD_push_node(NJD *njd,NJDNode *node)

{
  NJDNode *node_local;
  NJD *njd_local;
  
  node_local = node;
  if (njd->head == (NJDNode *)0x0) {
    njd->head = node;
  }
  else {
    njd->tail->next = node;
    node->prev = njd->tail;
  }
  for (; node_local->next != (_NJDNode *)0x0; node_local = node_local->next) {
  }
  njd->tail = node_local;
  return;
}

Assistant:

void NJD_push_node(NJD * njd, NJDNode * node)
{
   if (njd->head == NULL) {
      njd->head = node;
   } else {
      njd->tail->next = node;
      node->prev = njd->tail;
   }
   while (node->next != NULL)
      node = node->next;
   njd->tail = node;
}